

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Optional<Catch::ColourMode> Catch::Detail::stringToColourMode(StringRef colourMode)

{
  StringRef other;
  StringRef other_00;
  StringRef other_01;
  StringRef other_02;
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar2;
  StringRef *in_RDI;
  Optional<Catch::ColourMode> OVar3;
  StringRef *this;
  undefined7 in_stack_ffffffffffffff88;
  ColourMode in_stack_ffffffffffffff8f;
  StringRef *in_stack_ffffffffffffff90;
  ColourMode local_59 [24];
  ColourMode local_41 [24];
  ColourMode local_29 [41];
  
  this = in_RDI;
  StringRef::StringRef
            (in_stack_ffffffffffffff90,
             (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  other.m_start._7_1_ = in_stack_ffffffffffffff8f;
  other.m_start._0_7_ = in_stack_ffffffffffffff88;
  other.m_size = (size_type)in_stack_ffffffffffffff90;
  bVar1 = StringRef::operator==(this,other);
  if (bVar1) {
    local_29[0] = PlatformDefault;
    Optional<Catch::ColourMode>::Optional((Optional<Catch::ColourMode> *)in_RDI,local_29);
    uVar2 = extraout_RDX;
  }
  else {
    StringRef::StringRef
              (in_stack_ffffffffffffff90,
               (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    other_00.m_start._7_1_ = in_stack_ffffffffffffff8f;
    other_00.m_start._0_7_ = in_stack_ffffffffffffff88;
    other_00.m_size = (size_type)in_stack_ffffffffffffff90;
    bVar1 = StringRef::operator==(this,other_00);
    if (bVar1) {
      local_41[0] = ANSI;
      Optional<Catch::ColourMode>::Optional((Optional<Catch::ColourMode> *)in_RDI,local_41);
      uVar2 = extraout_RDX_00;
    }
    else {
      StringRef::StringRef
                (in_stack_ffffffffffffff90,
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      other_01.m_start._7_1_ = in_stack_ffffffffffffff8f;
      other_01.m_start._0_7_ = in_stack_ffffffffffffff88;
      other_01.m_size = (size_type)in_stack_ffffffffffffff90;
      bVar1 = StringRef::operator==(this,other_01);
      if (bVar1) {
        local_59[0] = Win32;
        Optional<Catch::ColourMode>::Optional((Optional<Catch::ColourMode> *)in_RDI,local_59);
        uVar2 = extraout_RDX_01;
      }
      else {
        StringRef::StringRef
                  (in_stack_ffffffffffffff90,
                   (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
        other_02.m_start._7_1_ = in_stack_ffffffffffffff8f;
        other_02.m_start._0_7_ = in_stack_ffffffffffffff88;
        other_02.m_size = (size_type)in_stack_ffffffffffffff90;
        bVar1 = StringRef::operator==(this,other_02);
        if (bVar1) {
          Optional<Catch::ColourMode>::Optional
                    ((Optional<Catch::ColourMode> *)in_RDI,&stack0xffffffffffffff8f);
          uVar2 = extraout_RDX_02;
        }
        else {
          Optional<Catch::ColourMode>::Optional((Optional<Catch::ColourMode> *)in_RDI);
          uVar2 = extraout_RDX_03;
        }
      }
    }
  }
  OVar3._8_8_ = uVar2;
  OVar3.nullableValue = (ColourMode *)this;
  return OVar3;
}

Assistant:

Optional<ColourMode> stringToColourMode( StringRef colourMode ) {
            if ( colourMode == "default" ) {
                return ColourMode::PlatformDefault;
            } else if ( colourMode == "ansi" ) {
                return ColourMode::ANSI;
            } else if ( colourMode == "win32" ) {
                return ColourMode::Win32;
            } else if ( colourMode == "none" ) {
                return ColourMode::None;
            } else {
                return {};
            }
        }